

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentSizeInitialCase::attachmentExists
          (AttachmentSizeInitialCase *this,GLenum attachment)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  StateQueryMemoryWriteGuard<int> state;
  undefined8 local_20;
  undefined4 local_18;
  
  local_20 = 0xdededededededede;
  local_18 = 0xdededede;
  glu::CallLogWrapper::glGetFramebufferAttachmentParameteriv
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,attachment,0x8cd0,
             (GLint *)((long)&local_20 + 4));
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar3 = true;
  if (local_20._4_1_ == -0x22) {
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      if (uVar2 == 3) break;
      uVar1 = uVar2 + 1;
    } while (*(char *)((long)&local_20 + uVar2 + 5) == -0x22);
    bVar3 = uVar2 < 3;
  }
  return (bool)(local_20._4_4_ != 0 & bVar3);
}

Assistant:

bool attachmentExists (GLenum attachment)
	{
		StateQueryMemoryWriteGuard<GLint> state;
		glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachment, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, &state);
		expectError(GL_NO_ERROR);

		return !state.isUndefined() && state != GL_NONE;
	}